

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

bool __thiscall cfd::core::AbstractTransaction::IsCoinBase(AbstractTransaction *this)

{
  int iVar1;
  size_t sStack_28;
  int ret;
  size_t coinbase;
  wally_tx *tx;
  AbstractTransaction *pAStack_10;
  bool is_coinbase;
  AbstractTransaction *this_local;
  
  tx._7_1_ = 0;
  coinbase = (size_t)this->wally_tx_pointer_;
  if ((wally_tx *)coinbase != (wally_tx *)0x0) {
    sStack_28 = 0;
    pAStack_10 = this;
    iVar1 = wally_tx_is_coinbase((wally_tx *)coinbase,&stack0xffffffffffffffd8);
    if ((iVar1 == 0) && (sStack_28 != 0)) {
      tx._7_1_ = 1;
    }
  }
  return (bool)(tx._7_1_ & 1);
}

Assistant:

bool AbstractTransaction::IsCoinBase() const {
  bool is_coinbase = false;
  struct wally_tx *tx = static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx != nullptr) {
    size_t coinbase = 0;
    int ret = wally_tx_is_coinbase(tx, &coinbase);
    if ((ret == WALLY_OK) && (coinbase != 0)) {
      is_coinbase = true;
    }
  }
  return is_coinbase;
}